

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sample02.cpp
# Opt level: O1

long __thiscall PyAnimal::go_abi_cxx11_(PyAnimal *this)

{
  object *object;
  Animal *in_RSI;
  function overload;
  object o;
  gil_scoped_acquire gil;
  object local_38;
  object local_30 [2];
  gil_scoped_acquire local_20;
  
  pybind11::gil_scoped_acquire::gil_scoped_acquire(&local_20);
  pybind11::get_overload<Animal>((pybind11 *)&local_38,in_RSI,"go");
  if (local_38.super_handle.m_ptr == (PyObject *)0x0) {
    pybind11::object::~object(&local_38);
    pybind11::gil_scoped_acquire::~gil_scoped_acquire(&local_20);
  }
  else {
    pybind11::detail::object_api<pybind11::handle>::operator()
              ((object_api<pybind11::handle> *)local_30,(int *)&local_38);
    pybind11::cast<std::__cxx11::string>
              ((enable_if_t<detail::move_if_unreferenced<basic_string<char>_>::value,_std::__cxx11::basic_string<char>_>
                *)this,(pybind11 *)local_30,object);
    pybind11::object::~object(local_30);
    pybind11::object::~object(&local_38);
    pybind11::gil_scoped_acquire::~gil_scoped_acquire(&local_20);
    if (local_38.super_handle.m_ptr != (PyObject *)0x0) {
      return (long)this;
    }
  }
  pybind11::pybind11_fail("Tried to call pure virtual function \"Animal::go\"");
}

Assistant:

std::string go(int n_times) override {
		PYBIND11_OVERLOAD_PURE(std::string, Animal, go, n_times);
	}